

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O2

BackendPtr __thiscall
WaveBackendFactory::createBackend(WaveBackendFactory *this,ALCdevice *device,BackendType type)

{
  WaveBackendFactory WVar1;
  undefined8 *puVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  
  if (in_ECX == 0) {
    WVar1 = (WaveBackendFactory)al_malloc(8,0x48);
    if (WVar1 == (WaveBackendFactory)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = pthread_once;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(ulong *)((long)WVar1 + 8) = CONCAT44(in_register_00000014,type);
    *(undefined ***)WVar1 = &PTR_open_001acbe0;
    *(undefined8 *)((long)WVar1 + 0x10) = 0;
    *(undefined8 *)((long)WVar1 + 0x18) = 0xffffffffffffffff;
    *(undefined8 *)((long)WVar1 + 0x20) = 0;
    *(undefined8 *)((long)WVar1 + 0x28) = 0;
    *(undefined8 *)((long)WVar1 + 0x30) = 0;
    *(undefined1 *)((long)WVar1 + 0x38) = 1;
    *(undefined8 *)((long)WVar1 + 0x40) = 0;
  }
  else {
    WVar1 = (WaveBackendFactory)0x0;
  }
  *this = WVar1;
  return (__uniq_ptr_data<BackendBase,_std::default_delete<BackendBase>,_true,_true>)
         (__uniq_ptr_data<BackendBase,_std::default_delete<BackendBase>,_true,_true>)this;
}

Assistant:

BackendPtr WaveBackendFactory::createBackend(ALCdevice *device, BackendType type)
{
    if(type == BackendType::Playback)
        return BackendPtr{new WaveBackend{device}};
    return nullptr;
}